

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall
testing::internal::OnCallSpec<long_(const_void_*,_long)>::Matches
          (OnCallSpec<long_(const_void_*,_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tr1::tuple<testing::Matcher<void_const*>,testing::Matcher<long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<void_const*,long,void,void,void,void,void,void,void,void>>
                    ((tuple<testing::Matcher<const_void_*>,_testing::Matcher<long>,_void,_void,_void,_void,_void,_void,_void,_void>
                      *)(this + 0x10),args);
  if (bVar1) {
    uVar2 = (**(code **)(**(long **)(this + 0x48) + 0x20))(*(long **)(this + 0x48),args);
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }